

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

void libxml_xmlTextReaderErrorCallback
               (void *arg,char *msg,int severity,xmlTextReaderLocatorPtr locator)

{
  long *plVar1;
  PyObject *op;
  PyObject *pPVar2;
  
  op = (PyObject *)PyTuple_New(4);
  PyTuple_SetItem(op,0,*(undefined8 *)((long)arg + 8));
  plVar1 = *(long **)((long)arg + 8);
  if (plVar1 != (long *)0x0) {
    *plVar1 = *plVar1 + 1;
  }
  pPVar2 = libxml_charPtrConstWrap(msg);
  PyTuple_SetItem(op,1,pPVar2);
  pPVar2 = libxml_intWrap(severity);
  PyTuple_SetItem(op,2,pPVar2);
  pPVar2 = libxml_xmlTextReaderLocatorPtrWrap(locator);
  PyTuple_SetItem(op,3,pPVar2);
  pPVar2 = (PyObject *)PyObject_CallObject(*arg,op);
  if (pPVar2 == (PyObject *)0x0) {
    PyErr_Print();
  }
  _Py_XDECREF(op);
  _Py_XDECREF(pPVar2);
  return;
}

Assistant:

static void 
libxml_xmlTextReaderErrorCallback(void *arg, 
				  const char *msg,
				  int severity,
				  xmlTextReaderLocatorPtr locator)
{
    xmlTextReaderPyCtxt *pyCtxt = (xmlTextReaderPyCtxt *)arg;
    PyObject *list;
    PyObject *result;
    
    list = PyTuple_New(4);
    PyTuple_SetItem(list, 0, pyCtxt->arg);
    Py_XINCREF(pyCtxt->arg);
    PyTuple_SetItem(list, 1, libxml_charPtrConstWrap(msg));
    PyTuple_SetItem(list, 2, libxml_intWrap(severity));
    PyTuple_SetItem(list, 3, libxml_xmlTextReaderLocatorPtrWrap(locator));
    result = PyObject_CallObject(pyCtxt->f, list);
    if (result == NULL)
    {
	/* TODO: manage for the exception to be propagated... */
	PyErr_Print();
    }
    Py_XDECREF(list);
    Py_XDECREF(result);
}